

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

int mbedtls_poly1305_mac(uchar *key,uchar *input,size_t ilen,uchar *mac)

{
  int local_7c;
  undefined1 local_78 [4];
  int ret;
  mbedtls_poly1305_context ctx;
  uchar *mac_local;
  size_t ilen_local;
  uchar *input_local;
  uchar *key_local;
  
  ctx.queue_len = (size_t)mac;
  mbedtls_poly1305_init((mbedtls_poly1305_context *)local_78);
  local_7c = mbedtls_poly1305_starts((mbedtls_poly1305_context *)local_78,key);
  if ((local_7c == 0) &&
     (local_7c = mbedtls_poly1305_update((mbedtls_poly1305_context *)local_78,input,ilen),
     local_7c == 0)) {
    local_7c = mbedtls_poly1305_finish((mbedtls_poly1305_context *)local_78,(uchar *)ctx.queue_len);
  }
  mbedtls_poly1305_free((mbedtls_poly1305_context *)local_78);
  return local_7c;
}

Assistant:

int mbedtls_poly1305_mac( const unsigned char key[32],
                          const unsigned char *input,
                          size_t ilen,
                          unsigned char mac[16] )
{
    mbedtls_poly1305_context ctx;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    POLY1305_VALIDATE_RET( key != NULL );
    POLY1305_VALIDATE_RET( mac != NULL );
    POLY1305_VALIDATE_RET( ilen == 0 || input != NULL );

    mbedtls_poly1305_init( &ctx );

    ret = mbedtls_poly1305_starts( &ctx, key );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_poly1305_update( &ctx, input, ilen );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_poly1305_finish( &ctx, mac );

cleanup:
    mbedtls_poly1305_free( &ctx );
    return( ret );
}